

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildValue.h
# Opt level: O3

BuildValue * __thiscall
llbuild::buildsystem::BuildValue::operator=(BuildValue *this,BuildValue *rhs)

{
  uint uVar1;
  char *pcVar2;
  long lVar3;
  anon_union_80_2_ecfed234_for_valueData *paVar4;
  anon_union_80_2_ecfed234_for_valueData *paVar5;
  byte bVar6;
  
  bVar6 = 0;
  if (this != rhs) {
    if ((1 < this->numOutputInfos) && ((this->valueData).asOutputInfos != (FileInfo *)0x0)) {
      operator_delete__((this->valueData).asOutputInfos);
    }
    this->kind = rhs->kind;
    uVar1 = rhs->numOutputInfos;
    this->numOutputInfos = uVar1;
    (this->signature).value = (rhs->signature).value;
    paVar4 = &rhs->valueData;
    if (uVar1 < 2) {
      paVar5 = &this->valueData;
      for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
        (paVar5->asOutputInfo).device = (paVar4->asOutputInfo).device;
        paVar4 = (anon_union_80_2_ecfed234_for_valueData *)((long)paVar4 + (ulong)bVar6 * -0x10 + 8)
        ;
        paVar5 = (anon_union_80_2_ecfed234_for_valueData *)((long)paVar5 + (ulong)bVar6 * -0x10 + 8)
        ;
      }
    }
    else {
      (this->valueData).asOutputInfo.device = (paVar4->asOutputInfo).device;
      (paVar4->asOutputInfo).device = 0;
    }
    if ((rhs->kind < SuccessfulCommandWithOutputSignature) &&
       ((0x10090U >> (rhs->kind & (FilteredDirectoryContents|Target)) & 1) != 0)) {
      (this->stringValues).size = (rhs->stringValues).size;
      pcVar2 = (this->stringValues).contents;
      if (pcVar2 != (char *)0x0) {
        operator_delete__(pcVar2);
      }
      (this->stringValues).contents = (rhs->stringValues).contents;
      (rhs->stringValues).contents = (char *)0x0;
    }
  }
  return this;
}

Assistant:

BuildValue& operator=(BuildValue&& rhs) {
    if (this != &rhs) {
      // Release our resources.
      if (hasMultipleOutputs())
        delete[] valueData.asOutputInfos;

      // Move the data.
      kind = rhs.kind;
      numOutputInfos = rhs.numOutputInfos;
      signature = rhs.signature;
      if (rhs.hasMultipleOutputs()) {
        valueData.asOutputInfos = rhs.valueData.asOutputInfos;
        rhs.valueData.asOutputInfos = nullptr;
      } else {
        valueData.asOutputInfo = rhs.valueData.asOutputInfo;
      }
      if (rhs.kindHasStringList()) {
        stringValues = std::move(rhs.stringValues);
      }
    }
    return *this;
  }